

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTcPrsMem::delete_all(CTcPrsMem *this)

{
  tcprsmem_blk_t *ptVar1;
  tcprsmem_blk_t *__ptr;
  
  __ptr = this->head_;
  while (__ptr != (tcprsmem_blk_t *)0x0) {
    ptVar1 = __ptr->next_;
    free(__ptr);
    this->head_ = ptVar1;
    __ptr = ptVar1;
  }
  this->tail_ = (tcprsmem_blk_t *)0x0;
  return;
}

Assistant:

void CTcPrsMem::delete_all()
{
    /* free all blocks */
    while (head_ != 0)
    {
        tcprsmem_blk_t *nxt;

        /* remember the next block after this one */
        nxt = head_->next_;

        /* free this block */
        t3free(head_);

        /* move on to the next one */
        head_ = nxt;
    }

    /* there's no tail now */
    tail_ = 0;
}